

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O2

int ndn_unix_client_face_up(ndn_face_intf *self)

{
  int iVar1;
  ndn_msg *pnVar2;
  
  iVar1 = 0;
  if ((self->state != '\x01') && (iVar1 = ndn_unix_face_up(self), iVar1 == 0)) {
    iVar1 = connect(*(int *)&self[4].up,(sockaddr *)(self + 1),0x6e);
    if (iVar1 == -1) {
      (*self->down)(self);
      iVar1 = 2;
    }
    else {
      iVar1 = 0;
      pnVar2 = ndn_msgqueue_post(self,ndn_unix_face_recv,0,(void *)0x0);
      *(ndn_msg **)&self[3].face_id = pnVar2;
      if (pnVar2 == (ndn_msg *)0x0) {
        (*self->down)(self);
        iVar1 = -0x39;
      }
      else {
        self->state = '\x01';
      }
    }
  }
  return iVar1;
}

Assistant:

static int
ndn_unix_client_face_up(struct ndn_face_intf* self){
  ndn_unix_face_t* ptr = container_of(self, ndn_unix_face_t, intf);
  int ret = 0;

  if(self->state == NDN_FACE_STATE_UP){
    return NDN_SUCCESS;
  }
  ret = ndn_unix_face_up(self);
  if(ret != NDN_SUCCESS){
    return ret;
  }

  if(connect(ptr->sock, (struct sockaddr*)&ptr->addr, sizeof(ptr->addr)) == -1){
    ndn_face_down(self);
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }

  ptr->process_event = ndn_msgqueue_post(ptr, ndn_unix_face_recv, 0, NULL);
  if(ptr->process_event == NULL){
    ndn_face_down(self);
    return NDN_FWD_MSGQUEUE_FULL;
  }

  self->state = NDN_FACE_STATE_UP;
  return NDN_SUCCESS;
}